

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_GenSorter(char *pFileName,int nVars)

{
  uint uVar1;
  FILE *__stream;
  char *pcVar2;
  int nDigits;
  int Counter;
  int k;
  int i;
  FILE *pFile;
  int nVars_local;
  char *pFileName_local;
  
  if (1 < nVars) {
    __stream = fopen(pFileName,"w");
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"# %d-bit sorter generated by ABC on %s\n",(ulong)(uint)nVars,pcVar2);
    fprintf(__stream,".model Sorter%02d\n",(ulong)(uint)nVars);
    fprintf(__stream,".inputs");
    for (Counter = 0; Counter < nVars; Counter = Counter + 1) {
      fprintf(__stream," x%02d",(ulong)(uint)Counter);
    }
    fprintf(__stream,"\n");
    fprintf(__stream,".outputs");
    for (Counter = 0; Counter < nVars; Counter = Counter + 1) {
      fprintf(__stream," y%02d",(ulong)(uint)Counter);
    }
    fprintf(__stream,"\n");
    uVar1 = Abc_Base10Log((nVars + -2) * nVars);
    if (nVars == 2) {
      fprintf(__stream,".subckt Comp a=x00 b=x01 x=y00 y=y01\n");
    }
    else {
      fprintf(__stream,".subckt Layer0");
      for (nDigits = 0; nDigits < nVars; nDigits = nDigits + 1) {
        fprintf(__stream," x%02d=x%02d",(ulong)(uint)nDigits,(ulong)(uint)nDigits);
      }
      for (nDigits = 0; nDigits < nVars; nDigits = nDigits + 1) {
        fprintf(__stream," y%02d=%0*d",(ulong)(uint)nDigits,(ulong)uVar1);
      }
      fprintf(__stream,"\n");
      for (Counter = 1; Counter < nVars * 2 + -2; Counter = Counter + 1) {
        fprintf(__stream,".subckt Layer%d",(ulong)(Counter & 1));
        for (nDigits = 0; nDigits < nVars; nDigits = nDigits + 1) {
          fprintf(__stream," x%02d=%0*d",(ulong)(uint)nDigits,(ulong)uVar1);
        }
        for (nDigits = 0; nDigits < nVars; nDigits = nDigits + 1) {
          fprintf(__stream," y%02d=%0*d",(ulong)(uint)nDigits,(ulong)uVar1);
        }
        fprintf(__stream,"\n");
      }
      fprintf(__stream,".subckt Layer%d",(ulong)(Counter & 1));
      for (nDigits = 0; nDigits < nVars; nDigits = nDigits + 1) {
        fprintf(__stream," x%02d=%0*d",(ulong)(uint)nDigits,(ulong)uVar1);
      }
      for (nDigits = 0; nDigits < nVars; nDigits = nDigits + 1) {
        fprintf(__stream," y%02d=y%02d",(ulong)(uint)nDigits,(ulong)(uint)nDigits);
      }
      fprintf(__stream,"\n");
    }
    fprintf(__stream,".end\n");
    fprintf(__stream,"\n");
    Abc_WriteLayer((FILE *)__stream,nVars,0);
    Abc_WriteLayer((FILE *)__stream,nVars,1);
    Abc_WriteComp((FILE *)__stream);
    fclose(__stream);
    return;
  }
  __assert_fail("nVars > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcGen.c"
                ,0x108,"void Abc_GenSorter(char *, int)");
}

Assistant:

void Abc_GenSorter( char * pFileName, int nVars )
{
    FILE * pFile;
    int i, k, Counter, nDigits;

    assert( nVars > 1 );

    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# %d-bit sorter generated by ABC on %s\n", nVars, Extra_TimeStamp() );
    fprintf( pFile, ".model Sorter%02d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " x%02d", i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " y%02d", i );
    fprintf( pFile, "\n" );

    Counter = 0;
    nDigits = Abc_Base10Log( (nVars-2)*nVars );
    if ( nVars == 2 )
        fprintf( pFile, ".subckt Comp a=x00 b=x01 x=y00 y=y01\n" );
    else
    {
        fprintf( pFile, ".subckt Layer0" );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " x%02d=x%02d", k, k );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " y%02d=%0*d", k, nDigits, Counter++ );
        fprintf( pFile, "\n" );
        Counter -= nVars;
        for ( i = 1; i < 2*nVars-2; i++ )
        {
            fprintf( pFile, ".subckt Layer%d", (i&1) );
            for ( k = 0; k < nVars; k++ )
                fprintf( pFile, " x%02d=%0*d", k, nDigits, Counter++ );
            for ( k = 0; k < nVars; k++ )
                fprintf( pFile, " y%02d=%0*d", k, nDigits, Counter++ );
            fprintf( pFile, "\n" );
            Counter -= nVars;
        }
        fprintf( pFile, ".subckt Layer%d", (i&1) );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " x%02d=%0*d", k, nDigits, Counter++ );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " y%02d=y%02d", k, k );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );

    Abc_WriteLayer( pFile, nVars, 0 );
    Abc_WriteLayer( pFile, nVars, 1 );
    Abc_WriteComp( pFile );
    fclose( pFile );
}